

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O3

word Abc_Isop6Cover(word uOn,word uOnDc,word *pRes,int nVars,word CostLim,int *pCover)

{
  int *piVar1;
  word wVar2;
  word wVar3;
  word wVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int nVars_00;
  ulong uVar10;
  int *piVar11;
  ulong uOnDc_00;
  ulong uOnDc_01;
  word uRes2;
  word uRes1;
  word uRes0;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (6 < nVars) {
    __assert_fail("nVars <= 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                  ,0x70,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
  }
  if ((~uOnDc & uOn) == 0) {
    if (uOn == 0) {
      *pRes = 0;
      CostLim = 0;
    }
    else if (uOnDc == 0xffffffffffffffff) {
      CostLim = 0x100000000;
      *pRes = 0xffffffffffffffff;
      if (pCover != (int *)0x0) {
        *pCover = 0;
      }
    }
    else {
      if (nVars < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                      ,0x7d,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
      }
      iVar6 = nVars * 2;
      uVar8 = (ulong)(uint)nVars;
      do {
        uVar10 = uVar8;
        iVar6 = iVar6 + -2;
        if ((long)uVar10 < 1) {
          __assert_fail("Var >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                        ,0x82,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
        }
        bVar5 = (byte)(1 << ((char)uVar10 - 1U & 0x1f));
      } while (((*(ulong *)(&UINT_008c7c68 + uVar10 * 2) & (uOn >> (bVar5 & 0x3f) ^ uOn)) == 0) &&
              (uVar8 = uVar10 - 1,
              (*(ulong *)(&UINT_008c7c68 + uVar10 * 2) & (uOnDc >> (bVar5 & 0x3f) ^ uOnDc)) == 0));
      nVars_00 = (int)(uVar10 - 1);
      uVar10 = uVar10 - 1 & 0xffffffff;
      uVar8 = s_Truths6Neg[uVar10];
      uVar10 = s_Truths6[uVar10];
      uVar9 = (uVar8 & uOn) << (bVar5 & 0x3f) | uVar8 & uOn;
      uOnDc_01 = (uVar8 & uOnDc) << (bVar5 & 0x3f) | uVar8 & uOnDc;
      uOnDc_00 = (uOnDc & uVar10) >> (bVar5 & 0x3f) | uOnDc & uVar10;
      wVar2 = Abc_Isop6Cover(~uOnDc_00 & uVar9,uOnDc_01,&local_38,nVars_00,CostLim,pCover);
      if (wVar2 < CostLim) {
        uVar7 = (uVar10 & uOn) >> (bVar5 & 0x3f) | uVar10 & uOn;
        piVar1 = pCover + ((long)wVar2 >> 0x20);
        piVar11 = piVar1;
        if (pCover == (int *)0x0) {
          piVar11 = (int *)0x0;
        }
        wVar3 = Abc_Isop6Cover(~uOnDc_01 & uVar7,uOnDc_00,&local_40,nVars_00,CostLim,piVar11);
        if (wVar2 + wVar3 < CostLim) {
          piVar11 = piVar1 + ((long)wVar3 >> 0x20);
          if (pCover == (int *)0x0) {
            piVar11 = (int *)0x0;
          }
          wVar4 = Abc_Isop6Cover(uVar7 & ~local_40 | uVar9 & ~local_38,uOnDc_00 & uOnDc_01,&local_48
                                 ,nVars_00,CostLim,piVar11);
          uVar9 = wVar4 + wVar2 + wVar3;
          if (uVar9 < CostLim) {
            local_48 = local_40 & uVar10 | local_38 & uVar8 | local_48;
            *pRes = local_48;
            if ((local_48 & ~uOnDc) != 0 || (~local_48 & uOn) != 0) {
              __assert_fail("(uOn & ~*pRes) == 0 && (*pRes & ~uOnDc) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                            ,0x91,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
            }
            if (pCover != (int *)0x0) {
              if (0 < (int)(wVar2 >> 0x20)) {
                uVar8 = 0;
                do {
                  pCover[uVar8] = pCover[uVar8] | 1 << ((byte)iVar6 & 0x1f);
                  uVar8 = uVar8 + 1;
                } while (wVar2 >> 0x20 != uVar8);
              }
              if (0 < (int)(wVar3 >> 0x20)) {
                uVar8 = 0;
                do {
                  piVar1[uVar8] = piVar1[uVar8] | 2 << ((byte)iVar6 & 0x1f);
                  uVar8 = uVar8 + 1;
                } while (wVar3 >> 0x20 != uVar8);
              }
            }
            CostLim = ((long)wVar3 >> 0x20) + ((long)wVar2 >> 0x20) + uVar9;
          }
        }
      }
    }
    return CostLim;
  }
  __assert_fail("(uOn & ~uOnDc) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                ,0x71,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
}

Assistant:

word Abc_Isop6Cover( word uOn, word uOnDc, word * pRes, int nVars, word CostLim, int * pCover )
{
    word uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    word Cost0, Cost1, Cost2;  int Var; 
    assert( nVars <= 6 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
    {
        pRes[0] = 0;
        return 0;
    }
    if ( uOnDc == ~(word)0 )
    {
        pRes[0] = ~(word)0;
        if ( pCover ) pCover[0] = 0;
        return Abc_Cube2Cost(1);
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt6HasVar( uOn, Var ) || Abc_Tt6HasVar( uOnDc, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = Abc_Tt6Cofactor0( uOn,   Var );
    uOn1   = Abc_Tt6Cofactor1( uOn  , Var );
    uOnDc0 = Abc_Tt6Cofactor0( uOnDc, Var );
    uOnDc1 = Abc_Tt6Cofactor1( uOnDc, Var );
    // solve for cofactors
    Cost0 = Abc_Isop6Cover( uOn0 & ~uOnDc1, uOnDc0, &uRes0, Var, CostLim, pCover );
    if ( Cost0 >= CostLim ) return CostLim;
    Cost1 = Abc_Isop6Cover( uOn1 & ~uOnDc0, uOnDc1, &uRes1, Var, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) : NULL );
    if ( Cost0 + Cost1 >= CostLim ) return CostLim;
    Cost2 = Abc_Isop6Cover( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, &uRes2, Var, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1) : NULL );
    if ( Cost0 + Cost1 + Cost2 >= CostLim ) return CostLim;
    // derive the final truth table
    *pRes = uRes2 | (uRes0 & s_Truths6Neg[Var]) | (uRes1 & s_Truths6[Var]);
    assert( (uOn & ~*pRes) == 0 && (*pRes & ~uOnDc) == 0 );
    Abc_IsopAddLits( pCover, Cost0, Cost1, Var );
    return Cost0 + Cost1 + Cost2 + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1);
}